

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_idte(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  _Bool _Var1;
  uintptr_t o_1;
  TCGv_i32 pTVar2;
  int32_t val;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  TCGv_i64 local_28;
  TCGTemp *local_20;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = s390_has_feat(s->uc,S390_FEAT_LOCAL_TLB_CLEARING);
  val = 0;
  if (_Var1) {
    if (((s->fields).presentO & 0x20) == 0) {
      __assert_fail("have_field1(s, o)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                    ,0x44d,
                    "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
                   );
    }
    val = (s->fields).c[3];
  }
  pTVar2 = tcg_const_i32_s390x(tcg_ctx,val);
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_30 = o->in1 + (long)tcg_ctx;
  local_28 = o->in2 + (long)tcg_ctx;
  local_20 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  tcg_gen_callN_s390x(tcg_ctx,helper_idte,(TCGTemp *)0x0,4,&local_38);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_idte(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 m4;

    if (s390_has_feat(s->uc, S390_FEAT_LOCAL_TLB_CLEARING)) {
        m4 = tcg_const_i32(tcg_ctx, get_field(s, m4));
    } else {
        m4 = tcg_const_i32(tcg_ctx, 0);
    }
    gen_helper_idte(tcg_ctx, tcg_ctx->cpu_env, o->in1, o->in2, m4);
    tcg_temp_free_i32(tcg_ctx, m4);
    return DISAS_NEXT;
}